

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_DEFB(Context *ctx)

{
  char *pcVar1;
  char local_58 [8];
  char varname [64];
  Context *ctx_local;
  
  get_GLSL_destarg_varname(ctx,local_58,0x40);
  push_output(ctx,&ctx->globals);
  pcVar1 = "false";
  if (ctx->dwords[0] != 0) {
    pcVar1 = "true";
  }
  output_line(ctx,"const bool %s = %s;",local_58,pcVar1);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_DEFB(Context *ctx)
{
    char varname[64]; get_GLSL_destarg_varname(ctx, varname, sizeof (varname));
    push_output(ctx, &ctx->globals);
    output_line(ctx, "const bool %s = %s;",
                varname, ctx->dwords[0] ? "true" : "false");
    pop_output(ctx);
}